

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_congruential.hpp
# Opt level: O0

void __thiscall
boost::random::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::seed
          (linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *this,uint *x0)

{
  uint *x0_local;
  linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *this_local;
  
  this->_x = *x0 % 0x7fffffff;
  if ((this->_x == 0) && (this->_x != 0)) {
    this->_x = this->_x + 0x7fffffff;
  }
  if (this->_x == 0) {
    this->_x = 1;
  }
  return;
}

Assistant:

BOOST_RANDOM_DETAIL_ARITHMETIC_SEED(linear_congruential_engine, IntType, x0)
    {
        // wrap _x if it doesn't fit in the destination
        if(modulus == 0) {
            _x = x0;
        } else {
            _x = x0 % modulus;
        }
        // handle negative seeds
        if(_x <= 0 && _x != 0) {
            _x += modulus;
        }
        // adjust to the correct range
        if(increment == 0 && _x == 0) {
            _x = 1;
        }
        BOOST_ASSERT(_x >= (min)());
        BOOST_ASSERT(_x <= (max)());
    }